

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

uint rotate(logdir *ld)

{
  taia *t;
  char *s;
  uint uVar1;
  int iVar2;
  int *piVar3;
  char tmp [41];
  
  if (ld->fddir == -1) {
    ld->tmax = 0;
    uVar1 = 0;
  }
  else {
    if (ld->ppid != 0) {
      do {
        uVar1 = processorstop(ld);
      } while (uVar1 == 0);
    }
    while (iVar2 = fchdir(ld->fddir), iVar2 == -1) {
      pause2("unable to change directory, want rotate",ld->name);
    }
    s = ld->fnsave;
    ld->fnsave[0x19] = '.';
    ld->fnsave[0x1a] = ((ld->processor).len != 0) * '\x02' + 's';
    ld->fnsave[0x1b] = '\0';
    do {
      do {
        taia_now(&now);
        fmt_taia(s,&now);
        piVar3 = __errno_location();
        *piVar3 = 0;
        iVar2 = stat(s,(stat *)&st);
      } while (iVar2 != -1);
    } while (*piVar3 != error_noent);
    if (ld->tmax != 0) {
      t = &ld->trotate;
      iVar2 = taia_less(t,&now);
      if (iVar2 != 0) {
        taia_uint(t,(uint)ld->tmax);
        taia_add(t,&now,t);
        iVar2 = taia_less(t,&trotate);
        if (iVar2 != 0) {
          trotate.atto = (ld->trotate).atto;
          trotate.sec.x = (t->sec).x;
          trotate.nano = (ld->trotate).nano;
        }
      }
    }
    if (ld->size != 0) {
      buffer_flush(&ld->b);
      while (iVar2 = fsync(ld->fdcur), iVar2 == -1) {
        pause2("unable to fsync current logfile",ld->name);
      }
      while (iVar2 = fchmod(ld->fdcur,0x1e4), iVar2 == -1) {
        pause2("unable to set mode of current",ld->name);
      }
      close(ld->fdcur);
      if (verbose != 0) {
        tmp[0] = ' ';
        uVar1 = fmt_ulong(tmp + 1,ld->size);
        tmp[uVar1 + 1] = '\0';
        strerr_warn("svlogd: info: ","rename: ",ld->name,"/current ",s,tmp,(strerr *)0x0);
      }
      while (iVar2 = rename("current",s), iVar2 == -1) {
        pause2("unable to rename current",ld->name);
      }
      while( true ) {
        iVar2 = open_append("current");
        ld->fdcur = iVar2;
        if (iVar2 != -1) break;
        pause2("unable to create new current",ld->name);
      }
      coe(iVar2);
      ld->size = 0;
      while (iVar2 = fchmod(ld->fdcur,0x1a4), iVar2 == -1) {
        pause2("unable to set mode of current",ld->name);
      }
      rmoldest(ld);
      processorstart(ld);
    }
    uVar1 = 1;
    while (iVar2 = fchdir(fdwdir), iVar2 == -1) {
      pause1("unable to change to initial working directory");
    }
  }
  return uVar1;
}

Assistant:

unsigned int rotate(struct logdir *ld) {
  char tmp[FMT_ULONG +1];

  if (ld->fddir == -1) { ld->tmax =0; return(0); }
  if (ld->ppid) while(! processorstop(ld));

  while (fchdir(ld->fddir) == -1)
    pause2("unable to change directory, want rotate", ld->name);

  /* create new filename */
  ld->fnsave[25] ='.';
  if (ld->processor.len)
    ld->fnsave[26] ='u';
  else
    ld->fnsave[26] ='s';
  ld->fnsave[27] =0;
  do {
    taia_now(&now);
    fmt_taia(ld->fnsave, &now);
    errno =0;
  } while ((stat(ld->fnsave, &st) != -1) || (errno != error_noent));

  if (ld->tmax && taia_less(&ld->trotate, &now)) {
    taia_uint(&ld->trotate, ld->tmax);
    taia_add(&ld->trotate, &now, &ld->trotate);
    if (taia_less(&ld->trotate, &trotate)) trotate =ld->trotate;
  }

  if (ld->size > 0) {
    buffer_flush(&ld->b);
    while (fsync(ld->fdcur) == -1)
      pause2("unable to fsync current logfile", ld->name);
    while (fchmod(ld->fdcur, 0744) == -1)
      pause2("unable to set mode of current", ld->name);
    close(ld->fdcur);
    if (verbose) {
      tmp[0] =' '; tmp[fmt_ulong(tmp +1, ld->size) +1] =0;
      strerr_warn6(INFO, "rename: ", ld->name, "/current ",
                   ld->fnsave, tmp, 0);
    }
    while (rename("current", ld->fnsave) == -1)
      pause2("unable to rename current", ld->name);
    while ((ld->fdcur =open_append("current")) == -1)
      pause2("unable to create new current", ld->name);
    coe(ld->fdcur);
    ld->size =0;
    while (fchmod(ld->fdcur, 0644) == -1)
      pause2("unable to set mode of current", ld->name);
    rmoldest(ld);
    processorstart(ld);
  }

  while (fchdir(fdwdir) == -1)
    pause1("unable to change to initial working directory");
  return(1);
}